

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int ipv6_cb(char *elem,size_t len,void *usr)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte local_39;
  void *local_38;
  
  iVar2 = *(int *)((long)usr + 0x10);
  lVar6 = (long)iVar2;
  iVar5 = 0;
  if (lVar6 != 0x10) {
    if (len == 0) {
      if (*(int *)((long)usr + 0x14) == -1) {
        *(int *)((long)usr + 0x14) = iVar2;
      }
      else if (*(int *)((long)usr + 0x14) != iVar2) {
        return 0;
      }
      if (2 < *(int *)((long)usr + 0x18)) {
        return 0;
      }
      *(int *)((long)usr + 0x18) = *(int *)((long)usr + 0x18) + 1;
    }
    else if (len < 5) {
      uVar4 = 0;
      sVar1 = 0;
      local_38 = usr;
      do {
        sVar3 = sVar1;
        if (len == sVar3) {
          *(ushort *)((long)local_38 + lVar6) = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
          break;
        }
        iVar2 = OPENSSL_fromxdigit(&local_39,(int)elem[sVar3]);
        uVar4 = (uint)local_39 | uVar4 << 4;
        sVar1 = sVar3 + 1;
      } while (iVar2 != 0);
      if (len != sVar3) {
        return 0;
      }
      *(int *)((long)local_38 + 0x10) = *(int *)((long)local_38 + 0x10) + 2;
    }
    else {
      if (0xc < iVar2) {
        return 0;
      }
      if (elem[len] != '\0') {
        return 0;
      }
      iVar2 = ipv4_from_asc((uint8_t *)(lVar6 + (long)usr),elem);
      if (iVar2 == 0) {
        return 0;
      }
      *(int *)((long)usr + 0x10) = *(int *)((long)usr + 0x10) + 4;
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int ipv6_cb(const char *elem, size_t len, void *usr) {
  IPV6_STAT *s = reinterpret_cast<IPV6_STAT *>(usr);
  // Error if 16 bytes written
  if (s->total == 16) {
    return 0;
  }
  if (len == 0) {
    // Zero length element, corresponds to '::'
    if (s->zero_pos == -1) {
      s->zero_pos = s->total;
    } else if (s->zero_pos != s->total) {
      // If we've already got a :: its an error
      return 0;
    }
    if (s->zero_cnt >= 3) {
      // More than three zeros is an error.
      return 0;
    }
    s->zero_cnt++;
  } else {
    // If more than 4 characters could be final a.b.c.d form
    if (len > 4) {
      // Need at least 4 bytes left
      if (s->total > 12) {
        return 0;
      }
      // Must be end of string
      if (elem[len]) {
        return 0;
      }
      if (!ipv4_from_asc(s->tmp + s->total, elem)) {
        return 0;
      }
      s->total += 4;
    } else {
      if (!ipv6_hex(s->tmp + s->total, elem, len)) {
        return 0;
      }
      s->total += 2;
    }
  }
  return 1;
}